

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWSImporter::SetupNodeName(LWSImporter *this,aiNode *nd,NodeDesc *src)

{
  ai_uint32 aVar1;
  uint uVar2;
  string *psVar3;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  uVar2 = src->type << 0x1c | src->number;
  if ((src->type == OBJECT) && ((src->path)._M_string_length != 0)) {
    psVar3 = &src->path;
    std::__cxx11::string::find_last_of((char *)psVar3,0x73605b,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_70,(ulong)psVar3);
    std::__cxx11::string::find_last_of((char *)local_70,0x7404ea,0xffffffffffffffff);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar3);
    std::__cxx11::string::substr((ulong)local_70,(ulong)local_50);
    aVar1 = snprintf((nd->mName).data,0x400,"%s_(%08X)",local_70[0],(ulong)uVar2);
    (nd->mName).length = aVar1;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  else {
    aVar1 = snprintf((nd->mName).data,0x400,"%s_(%08X)",src->name,(ulong)uVar2);
    (nd->mName).length = aVar1;
  }
  return;
}

Assistant:

void LWSImporter::SetupNodeName(aiNode* nd, LWS::NodeDesc& src)
{
    const unsigned int combined = src.number | ((unsigned int)src.type) << 28u;

    // the name depends on the type. We break LWS's strange naming convention
    // and return human-readable, but still machine-parsable and unique, strings.
    if (src.type == LWS::NodeDesc::OBJECT)  {

        if (src.path.length()) {
            std::string::size_type s = src.path.find_last_of("\\/");
            if (s == std::string::npos)
                s = 0;
            else ++s;
            std::string::size_type t = src.path.substr(s).find_last_of(".");

            nd->mName.length = ::ai_snprintf(nd->mName.data, MAXLEN, "%s_(%08X)",src.path.substr(s).substr(0,t).c_str(),combined);
            return;
        }
    }
    nd->mName.length = ::ai_snprintf(nd->mName.data, MAXLEN, "%s_(%08X)",src.name,combined);
}